

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O3

bool __thiscall
MipsParser::parseVfpuRegister(MipsParser *this,Parser *parser,MipsRegisterValue *reg,int size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char *pcVar4;
  int iVar5;
  Token *pTVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  pTVar6 = Tokenizer::peekToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar6->type != Identifier) {
    return false;
  }
  if (*(__index_type *)
       ((long)&(pTVar6->value).
               super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
       + 0x20) != '\x04') {
    __assert_fail("std::holds_alternative<Identifier>(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                  ,0x4d,"const Identifier &Token::identifierValue() const");
  }
  if (*(long *)((long)&(pTVar6->value).
                       super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                       super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
               + 8) != 4) {
    return false;
  }
  pcVar4 = *(char **)&(pTVar6->value).
                      super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      ._M_u;
  bVar1 = pcVar4[1];
  if (9 < (byte)(bVar1 - 0x30)) {
    return false;
  }
  bVar2 = pcVar4[2];
  if (9 < (byte)(bVar2 - 0x30)) {
    return false;
  }
  bVar3 = pcVar4[3];
  if (9 < (byte)(bVar3 - 0x30)) {
    return false;
  }
  iVar5 = tolower((int)*pcVar4);
  if (3 < (uint)size) {
    return false;
  }
  uVar7 = bVar3 - 0x30;
  if (3 < uVar7) {
    return false;
  }
  uVar10 = bVar2 - 0x30;
  if (3 < uVar10) {
    return false;
  }
  uVar11 = bVar1 - 0x30;
  if (7 < uVar11) {
    return false;
  }
  reg->num = 0;
  uVar8 = uVar7;
  if (iVar5 < 0x6d) {
    if (iVar5 == 99) {
      uVar9 = 0;
LAB_001672ee:
      reg->type = VfpuVector;
      if (size != 3) {
        if (size == 2) {
          if ((uVar8 & 2) != 0) {
            return false;
          }
          uVar8 = uVar8 * 2;
          goto LAB_0016732d;
        }
        if (size != 1) {
          return false;
        }
      }
      if ((uVar8 & 1) != 0) {
        return false;
      }
      goto LAB_0016732d;
    }
    if (iVar5 != 0x65) {
      return false;
    }
    reg->num = 0x20;
    uVar9 = 0x20;
  }
  else {
    uVar9 = 0;
    if (iVar5 != 0x6d) {
      if (iVar5 == 0x73) {
        reg->type = VfpuVector;
        uVar9 = 0;
        if (size != 0) {
          return false;
        }
        goto LAB_0016732d;
      }
      if (iVar5 != 0x72) {
        return false;
      }
      reg->num = 0x20;
      uVar9 = 0x20;
      uVar8 = uVar10;
      uVar10 = uVar7;
      goto LAB_001672ee;
    }
  }
  reg->type = VfpuMatrix;
  if (size != 3) {
    if (size == 2) {
      if (1 < uVar7) {
        return false;
      }
      uVar8 = uVar7 * 2;
      goto LAB_0016732d;
    }
    if (size != 1) {
      return false;
    }
  }
  if ((bVar3 & 1) != 0) {
    return false;
  }
LAB_0016732d:
  reg->num = uVar8 << 5 | uVar11 * 4 | uVar9 | uVar10;
  std::__cxx11::string::_M_assign((string *)&reg->name);
  Tokenizer::eatTokens
            ((parser->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].tokenizer,1);
  return true;
}

Assistant:

bool MipsParser::parseVfpuRegister(Parser& parser, MipsRegisterValue& reg, int size)
{
	const Token& token = parser.peekToken();
	if (token.type != TokenType::Identifier || token.identifierValue().size() != 4)
		return false;

	const Identifier &identifier = token.identifierValue();

	int mtx,col,row;
	if (!decodeDigit(identifier.string()[1],mtx)) return false;
	if (!decodeDigit(identifier.string()[2],col)) return false;
	if (!decodeDigit(identifier.string()[3],row)) return false;
	int mode = tolower(identifier.string()[0]);

	if (size < 0 || size > 3)
		return false;

	if (row > 3 || col > 3 || mtx > 7)
		return false;

	reg.num = 0;
	switch (mode)
	{
	case 'r':					// transposed vector
		reg.num |= (1 << 5);
		std::swap(col,row);
		[[fallthrough]];
	case 'c':					// vector	
		reg.type = MipsRegisterType::VfpuVector;

		switch (size)
		{
		case 1:	// pair
		case 3: // quad
			if (row & 1)
				return false;
			break;
		case 2:	// triple
			if (row & 2)
				return false;
			row <<= 1;
			break;
		default:
			return false;
		}
		break;
	case 's':					// single
		reg.type = MipsRegisterType::VfpuVector;

		if (size != 0)
			return false;
		break;
	case 'e':					// transposed matrix
		reg.num |= (1 << 5);
		[[fallthrough]];
	case 'm':					// matrix
		reg.type = MipsRegisterType::VfpuMatrix;

		// check size
		switch (size)
		{
		case 1:	// 2x2
		case 3:	// 4x4
			if (row & 1)
				return false;
			break;
		case 2:	// 3x3
			if (row & ~1)
				return false;
			row <<= 1;
			break;
		default:
			return false;
		}
		break;
	default:
		return false;
	}

	reg.num |= mtx << 2;
	reg.num |= col;
	reg.num |= row << 5;

	reg.name = identifier;
	parser.eatToken();
	return true;
}